

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementGeneric.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementGeneric::ComputeGravityForces
          (ChElementGeneric *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  shared_ptr<chrono::ChLoadableUVW> mloadable;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)Fg);
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x18);
  mloadable.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&__a2;
  mloadable.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_28._M_pi)->_M_use_count = 1;
  (local_28._M_pi)->_M_weak_count = 1;
  (local_28._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_0117f8a8;
  local_28._M_pi[1]._vptr__Sp_counted_base = (_func_int **)this;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<chrono::fea::ChElementGeneric_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementGeneric.cpp:135:58),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_deleter<chrono::fea::ChElementGeneric_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_cecilysunday[P]chrono_src_chrono_fea_ChElementGeneric_cpp:135:58),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&mloadable);
  std::dynamic_pointer_cast<chrono::ChLoadableUVW,chrono::fea::ChElementGeneric>
            ((shared_ptr<chrono::fea::ChElementGeneric> *)&mloadable);
  if (mloadable.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    bVar2 = ChVector<double>::operator!=(G_acc,(ChVector<double> *)&VNULL);
    if (bVar2) {
      std::
      make_shared<chrono::ChLoad<chrono::ChLoaderGravity>,std::shared_ptr<chrono::ChLoadableUVW>&>
                ((shared_ptr<chrono::ChLoadableUVW> *)&__a2);
      dVar3 = G_acc->m_data[2];
      dVar1 = G_acc->m_data[1];
      *(double *)((long)___a2 + 0x68) = G_acc->m_data[0];
      *(double *)((long)___a2 + 0x70) = dVar1;
      *(double *)((long)___a2 + 0x78) = dVar3;
      *(undefined4 *)((long)___a2 + 0x80) = 1;
      dVar3 = (double)(**(code **)((long)*mloadable.
                                          super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x70))();
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        std::__shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)___a2 + 0x58),
                   &mloadable.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>)
        ;
        (**(code **)(*(long *)___a2 + 0x60))(___a2,0,0);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                  (Fg,(Matrix<double,__1,_1,_0,__1,_1> *)((long)___a2 + 0x48));
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mloadable.super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

void ChElementGeneric::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {

    // A default fall-back implementation of the ComputeGravityForces that will work for all elements
    // inherited from ChLoadableUVW and with nonzero GetDensity(). You might override with more efficient implementations.

    Fg.setZero();

    // A null deleter: this is a hack to wrap "this" raw ptr, but we really need this 
    // because the ChLoaderGravity needs it as a shared pointer
    std::shared_ptr<ChElementGeneric> this_wrapper{this, [](ChElementGeneric*){} }; 

    if (auto mloadable = std::dynamic_pointer_cast<ChLoadableUVW>(this_wrapper)) {
        if (G_acc != VNULL) {
                auto common_gravity_loader = chrono_types::make_shared<ChLoad<ChLoaderGravity>>(mloadable);
                common_gravity_loader->loader.Set_G_acc(G_acc);
                common_gravity_loader->loader.SetNumIntPoints(1); //// TODO n. gauss points as parameter?
                if (mloadable->GetDensity()) {
                    // temporary set loader target and compute generalized forces term
                    common_gravity_loader->loader.loadable = mloadable;
                    common_gravity_loader->ComputeQ(nullptr, nullptr);
                    Fg = common_gravity_loader->loader.Q;
                }
        }
    }
}